

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

Gia_ManEra_t * Gia_ManEraCreate(Gia_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Gia_ManEra_t *p_00;
  uint *puVar3;
  Mem_Fixed_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  void *__src;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar6;
  int local_34;
  int i;
  uint *pSimInfo;
  uint *pTruth;
  Gia_ManEra_t *p;
  Vec_Ptr_t *vTruths;
  Gia_Man_t *pAig_local;
  
  p_00 = (Gia_ManEra_t *)calloc(1,0x58);
  p_00->pAig = pAig;
  iVar1 = Gia_ManPiNum(pAig);
  iVar1 = Abc_TruthWordNum(iVar1);
  p_00->nWordsSim = iVar1;
  iVar1 = Gia_ManRegNum(pAig);
  iVar1 = Abc_BitWordNum(iVar1);
  p_00->nWordsDat = iVar1;
  iVar1 = p_00->nWordsSim;
  iVar2 = Gia_ManObjNum(pAig);
  puVar3 = (uint *)malloc((long)(iVar1 * iVar2) << 2);
  p_00->pDataSim = puVar3;
  pMVar4 = Mem_FixedStart(p_00->nWordsDat * 4 + 0x10);
  p_00->pMemory = pMVar4;
  pVVar5 = Vec_PtrAlloc(100000);
  p_00->vStates = pVVar5;
  iVar1 = Abc_PrimeCudd(100000);
  p_00->nBins = iVar1;
  puVar3 = (uint *)calloc((long)p_00->nBins,4);
  p_00->pBins = puVar3;
  Vec_PtrPush(p_00->vStates,(void *)0x0);
  iVar1 = Gia_ManPiNum(pAig);
  pVVar5 = Vec_PtrAllocTruthTables(iVar1);
  for (local_34 = 0; iVar1 = Vec_PtrSize(pVVar5), local_34 < iVar1; local_34 = local_34 + 1) {
    __src = Vec_PtrEntry(pVVar5,local_34);
    pObj = Gia_ManPi(pAig,local_34);
    iVar1 = Gia_ObjId(pAig,pObj);
    puVar3 = Gia_ManEraData(p_00,iVar1);
    memcpy(puVar3,__src,(long)p_00->nWordsSim << 2);
  }
  Vec_PtrFree(pVVar5);
  puVar3 = Gia_ManEraData(p_00,0);
  memset(puVar3,0,(long)p_00->nWordsSim << 2);
  pVVar6 = Vec_IntAlloc(1000);
  p_00->vStgDump = pVVar6;
  return p_00;
}

Assistant:

Gia_ManEra_t * Gia_ManEraCreate( Gia_Man_t * pAig )
{
    Vec_Ptr_t * vTruths;
    Gia_ManEra_t * p;
    unsigned * pTruth, * pSimInfo;
    int i;
    p = ABC_CALLOC( Gia_ManEra_t, 1 );
    p->pAig      = pAig;
    p->nWordsSim = Abc_TruthWordNum( Gia_ManPiNum(pAig) );
    p->nWordsDat = Abc_BitWordNum( Gia_ManRegNum(pAig) );
    p->pDataSim  = ABC_ALLOC( unsigned, p->nWordsSim*Gia_ManObjNum(pAig) );
    p->pMemory   = Mem_FixedStart( sizeof(Gia_ObjEra_t) + sizeof(unsigned) * p->nWordsDat );
    p->vStates   = Vec_PtrAlloc( 100000 );
    p->nBins     = Abc_PrimeCudd( 100000 );
    p->pBins     = ABC_CALLOC( unsigned, p->nBins );
    Vec_PtrPush( p->vStates, NULL );
    // assign primary input values
    vTruths = Vec_PtrAllocTruthTables( Gia_ManPiNum(pAig) );
    Vec_PtrForEachEntry( unsigned *, vTruths, pTruth, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(pAig, Gia_ManPi(pAig, i)) );
        memcpy( pSimInfo, pTruth, sizeof(unsigned) * p->nWordsSim );
    }
    Vec_PtrFree( vTruths );
    // assign constant zero node
    pSimInfo = Gia_ManEraData( p, 0 );
    memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    p->vStgDump = Vec_IntAlloc( 1000 );
    return p;
}